

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sg_trace_scan_avx2_256_64.c
# Opt level: O0

parasail_result_t *
parasail_sg_flags_trace_scan_profile_avx2_256_64
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap,int s1_beg,int s1_end,
          int s2_beg,int s2_end)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  uint uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  longlong lVar8;
  ulong uVar9;
  __m256i vH_00;
  __m256i vH_01;
  undefined1 auVar10 [32];
  __m256i alVar11;
  __m256i b;
  __m256i b_00;
  __m256i b_01;
  __m256i b_02;
  __m256i b_03;
  __m256i b_04;
  __m256i b_05;
  __m256i b_06;
  __m256i b_07;
  __m256i b_08;
  __m256i b_09;
  __m256i b_10;
  __m256i b_11;
  __m256i a;
  __m256i a_00;
  __m256i a_01;
  __m256i a_02;
  __m256i a_03;
  __m256i a_04;
  __m256i a_05;
  __m256i a_06;
  __m256i a_07;
  __m256i a_08;
  __m256i a_09;
  __m256i a_10;
  __m256i a_11;
  __m256i a_12;
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [24];
  undefined1 auVar39 [24];
  int iVar40;
  long lVar41;
  ulong uVar42;
  int in_ECX;
  int in_EDX;
  long in_RSI;
  long in_RDI;
  int in_R8D;
  int in_R9D;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  long lVar50;
  long lVar51;
  ulong uVar52;
  ulong uVar53;
  long lVar54;
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  int in_stack_00000008;
  __m256i vH_1;
  int32_t temp;
  int32_t column_len;
  int64_t *t;
  __m256i vCompare;
  __m256i vFt;
  __m256i vFT;
  __m256i vET;
  __m256i vT;
  __m256i vGapper_1;
  __m256i case2;
  __m256i case1;
  __m256i vW;
  __m256i *pvW;
  __m256i vHp;
  __m256i vH;
  __m256i vF_opn;
  __m256i vF_ext;
  __m256i vF;
  __m256i vHt;
  __m256i vE_opn;
  __m256i vE_ext;
  __m256i vE;
  __m256i vGapper;
  int64_t tmp_1;
  int64_t tmp;
  __m256i_64_t e;
  __m256i_64_t h;
  int32_t segNum;
  int32_t index;
  __m256i vTDelF;
  __m256i vTDiagF;
  __m256i vTInsE;
  __m256i vTDiagE;
  __m256i vTDiag;
  __m256i vTDel;
  __m256i vTIns;
  parasail_result_t *result;
  __m256i vSegLenXgap;
  __m256i vNegInfFront;
  __m256i vPosMask;
  __m256i vMaxH;
  __m256i vSaturationCheckMax;
  __m256i vSaturationCheckMin;
  __m256i vPosLimit;
  __m256i vNegLimit;
  int64_t score;
  __m256i vZero;
  int64_t POS_LIMIT;
  int64_t NEG_LIMIT;
  __m256i vGapE;
  __m256i vGapO;
  __m256i *pvGapper;
  __m256i *pvH;
  __m256i *pvHt;
  int64_t *boundary;
  __m256i *pvE;
  __m256i *pvP;
  int32_t position;
  int32_t offset;
  int32_t segLen;
  int32_t segWidth;
  parasail_matrix_t *matrix;
  int32_t end_ref;
  int32_t end_query;
  int32_t s1Len;
  int32_t k;
  int32_t j;
  int32_t i;
  int32_t in_stack_ffffffffffffea6c;
  long in_stack_ffffffffffffea70;
  undefined4 in_stack_ffffffffffffea78;
  int in_stack_ffffffffffffea7c;
  long in_stack_ffffffffffffea80;
  ulong in_stack_ffffffffffffea88;
  undefined4 in_stack_ffffffffffffea90;
  int in_stack_ffffffffffffea94;
  ulong local_1560;
  ulong uStack_1558;
  __m256i *in_stack_ffffffffffffeab0;
  undefined8 in_stack_ffffffffffffeab8;
  undefined1 in_stack_ffffffffffffeac0 [16];
  undefined4 in_stack_ffffffffffffead0;
  undefined4 in_stack_ffffffffffffead4;
  undefined8 in_stack_ffffffffffffead8;
  longlong *plVar80;
  undefined8 in_stack_ffffffffffffeae0;
  undefined8 in_stack_ffffffffffffeae8;
  longlong in_stack_ffffffffffffeaf0;
  ulong uStack_1508;
  undefined8 local_1500;
  undefined8 uStack_14f8;
  undefined8 uStack_14f0;
  undefined8 uStack_14e8;
  undefined8 local_14e0;
  undefined8 uStack_14d8;
  undefined8 uStack_14d0;
  undefined8 uStack_14c8;
  undefined1 local_14c0 [16];
  undefined8 local_14a0;
  undefined8 uStack_1498;
  undefined8 uStack_1490;
  undefined8 uStack_1488;
  undefined8 local_1480;
  undefined8 uStack_1478;
  undefined8 uStack_1470;
  undefined1 local_1440 [16];
  undefined8 uStack_1430;
  undefined8 uStack_1428;
  undefined1 local_13e0 [32];
  ulong local_13c0;
  ulong uStack_13b8;
  ulong uStack_13b0;
  ulong uStack_13a8;
  ulong local_13a0;
  ulong uStack_1398;
  ulong uStack_1390;
  ulong uStack_1388;
  undefined8 local_1380;
  undefined8 uStack_1378;
  undefined8 uStack_1370;
  undefined8 uStack_1368;
  undefined1 local_1360 [32];
  undefined1 local_1340 [32];
  longlong local_1320;
  longlong lStack_1318;
  longlong lStack_1310;
  longlong lStack_1308;
  undefined8 local_1300;
  undefined8 uStack_12f8;
  undefined8 uStack_12f0;
  undefined8 uStack_12e8;
  undefined1 local_12c0 [32];
  longlong local_1280 [4];
  ulong local_1260 [7];
  int local_1228;
  int local_1224;
  undefined1 local_1220 [16];
  undefined1 auStack_1210 [16];
  undefined8 local_1200;
  undefined8 uStack_11f8;
  undefined8 uStack_11f0;
  undefined8 uStack_11e8;
  undefined8 local_11e0;
  undefined8 uStack_11d8;
  undefined8 uStack_11d0;
  undefined8 uStack_11c8;
  undefined8 local_11c0;
  undefined8 uStack_11b8;
  undefined8 uStack_11b0;
  undefined8 uStack_11a8;
  undefined8 local_11a0;
  undefined8 uStack_1198;
  undefined8 uStack_1190;
  undefined8 uStack_1188;
  undefined8 local_1180;
  undefined8 uStack_1178;
  undefined8 uStack_1170;
  undefined8 uStack_1168;
  undefined8 local_1160;
  undefined8 uStack_1158;
  undefined8 uStack_1150;
  undefined8 uStack_1148;
  parasail_result_t *local_1128;
  undefined1 local_1120 [32];
  ulong local_1100;
  undefined8 uStack_10f8;
  undefined8 uStack_10f0;
  undefined8 uStack_10e8;
  long local_10e0;
  long lStack_10d8;
  long lStack_10d0;
  long lStack_10c8;
  undefined1 local_10c0 [32];
  ulong local_10a0;
  ulong uStack_1098;
  ulong uStack_1090;
  ulong uStack_1088;
  undefined8 local_1080;
  undefined8 uStack_1078;
  undefined8 uStack_1070;
  undefined8 uStack_1068;
  undefined8 local_1060;
  undefined8 uStack_1058;
  undefined8 uStack_1050;
  undefined8 uStack_1048;
  ulong local_1040;
  ulong uStack_1038;
  ulong uStack_1030;
  ulong uStack_1028;
  ulong local_1008;
  undefined8 local_1000;
  undefined8 uStack_ff8;
  undefined8 uStack_ff0;
  undefined8 uStack_fe8;
  ulong local_fd0;
  ulong local_fc8;
  undefined1 local_fc0 [16];
  undefined1 auStack_fb0 [16];
  undefined8 local_fa0;
  undefined8 uStack_f98;
  undefined8 uStack_f90;
  undefined8 uStack_f88;
  __m256i *local_f80;
  longlong *local_f78;
  __m256i *local_f70;
  int64_t *local_f68;
  __m256i *local_f60;
  long local_f58;
  int local_f50;
  int local_f4c;
  uint local_f48;
  int local_f44;
  long local_f40;
  int local_f38;
  int local_f34;
  int local_f30;
  int local_f2c;
  int local_f28;
  uint local_f24;
  int local_f20;
  int local_f1c;
  int local_f18;
  int local_f14;
  long local_f10;
  parasail_result_t *local_f00;
  undefined8 local_ef8;
  undefined8 local_ef0;
  undefined8 local_ee8;
  undefined8 local_ee0;
  undefined8 local_ed8;
  undefined8 local_ed0;
  undefined8 local_ec8;
  ulong local_ec0;
  ulong local_eb8;
  ulong local_eb0;
  ulong local_ea8;
  ulong local_ea0;
  ulong local_e98;
  ulong local_e90;
  ulong local_e88;
  undefined1 local_e80 [32];
  ulong local_e60;
  ulong uStack_e58;
  ulong uStack_e50;
  ulong uStack_e48;
  ulong local_e40;
  ulong uStack_e38;
  ulong uStack_e30;
  ulong uStack_e28;
  ulong local_e20;
  ulong uStack_e18;
  ulong uStack_e10;
  ulong uStack_e08;
  ulong local_e00;
  ulong uStack_df8;
  ulong uStack_df0;
  ulong uStack_de8;
  long local_de0;
  long lStack_dd8;
  long lStack_dd0;
  long lStack_dc8;
  long local_dc0;
  long lStack_db8;
  long lStack_db0;
  long lStack_da8;
  undefined1 local_da0 [16];
  undefined1 auStack_d90 [16];
  ulong local_d80;
  ulong local_d78;
  ulong local_d70;
  ulong local_d68;
  undefined1 local_d60 [32];
  ulong local_d40;
  ulong local_d38;
  ulong local_d30;
  ulong local_d28;
  undefined1 local_d20 [16];
  undefined1 auStack_d10 [16];
  ulong local_d00;
  ulong local_cf8;
  ulong local_cf0;
  ulong local_ce8;
  undefined1 local_ce0 [16];
  undefined1 auStack_cd0 [16];
  ulong local_cc0;
  ulong local_cb8;
  ulong local_cb0;
  ulong local_ca8;
  undefined1 local_ca0 [16];
  undefined1 auStack_c90 [16];
  ulong local_c80;
  ulong local_c78;
  ulong local_c70;
  ulong local_c68;
  undefined1 local_c60 [16];
  undefined1 auStack_c50 [16];
  ulong local_c40;
  ulong local_c38;
  ulong local_c30;
  ulong local_c28;
  undefined1 local_c20 [16];
  undefined1 auStack_c10 [16];
  ulong local_c00;
  ulong local_bf8;
  ulong local_bf0;
  ulong local_be8;
  undefined1 local_be0 [16];
  undefined1 local_bd0 [16];
  ulong local_bc0;
  ulong local_bb8;
  ulong local_bb0;
  ulong local_ba8;
  undefined1 local_ba0 [16];
  undefined1 auStack_b90 [16];
  undefined8 local_b80;
  undefined8 local_b78;
  undefined8 local_b70;
  undefined8 local_b68;
  undefined1 local_b60 [16];
  undefined1 auStack_b50 [16];
  undefined8 local_b40;
  undefined8 local_b38;
  undefined8 local_b30;
  undefined8 local_b28;
  undefined1 local_b20 [16];
  undefined1 auStack_b10 [16];
  undefined8 local_b00;
  undefined8 local_af8;
  undefined8 local_af0;
  undefined8 local_ae8;
  undefined1 local_ae0 [16];
  undefined1 auStack_ad0 [16];
  undefined8 local_ac0;
  undefined8 local_ab8;
  undefined8 local_ab0;
  undefined8 local_aa8;
  undefined1 local_aa0 [16];
  undefined1 auStack_a90 [16];
  undefined8 local_a80;
  undefined8 local_a78;
  undefined8 local_a70;
  undefined8 local_a68;
  undefined1 local_a60 [16];
  undefined1 auStack_a50 [16];
  undefined8 local_a40;
  undefined8 local_a38;
  undefined8 local_a30;
  undefined8 local_a28;
  undefined1 local_a20 [32];
  undefined8 local_a00;
  undefined8 local_9f8;
  undefined8 local_9f0;
  undefined8 local_9e8;
  undefined1 local_9e0 [16];
  undefined1 auStack_9d0 [16];
  undefined8 local_9c0;
  undefined8 local_9b8;
  undefined8 local_9b0;
  undefined8 local_9a8;
  ulong local_9a0;
  undefined8 uStack_998;
  undefined8 uStack_990;
  undefined8 uStack_988;
  undefined8 local_980;
  undefined8 uStack_978;
  undefined8 uStack_970;
  undefined8 uStack_968;
  undefined8 local_960;
  undefined8 uStack_958;
  undefined8 uStack_950;
  undefined8 uStack_948;
  undefined8 local_940;
  undefined8 uStack_938;
  undefined8 uStack_930;
  undefined8 uStack_928;
  undefined8 local_920;
  undefined8 uStack_918;
  undefined8 uStack_910;
  longlong lStack_908;
  undefined8 local_900;
  undefined8 uStack_8f8;
  undefined8 uStack_8f0;
  undefined8 uStack_8e8;
  undefined8 local_8e0;
  undefined8 uStack_8d8;
  undefined8 uStack_8d0;
  undefined8 uStack_8c8;
  undefined8 local_8c0;
  undefined8 uStack_8b8;
  undefined8 uStack_8b0;
  undefined8 uStack_8a8;
  undefined8 local_8a0;
  undefined8 uStack_898;
  undefined8 uStack_890;
  longlong lStack_888;
  undefined8 local_880;
  undefined8 uStack_878;
  undefined8 uStack_870;
  undefined8 uStack_868;
  undefined1 local_860 [32];
  ulong local_840;
  undefined8 uStack_838;
  undefined8 uStack_830;
  undefined8 uStack_828;
  ulong local_820;
  ulong uStack_818;
  ulong uStack_810;
  ulong uStack_808;
  longlong *local_7e8;
  ulong local_7e0;
  ulong uStack_7d8;
  ulong uStack_7d0;
  ulong uStack_7c8;
  longlong *local_7a8;
  longlong local_7a0;
  longlong lStack_798;
  longlong lStack_790;
  longlong lStack_788;
  __m256i *local_768;
  longlong local_760;
  longlong lStack_758;
  longlong lStack_750;
  longlong lStack_748;
  __m256i *local_728;
  longlong local_720;
  longlong lStack_718;
  longlong lStack_710;
  longlong lStack_708;
  __m256i *local_6e8;
  __m256i *local_6a8;
  longlong *local_668;
  undefined1 local_660 [16];
  undefined1 auStack_650 [16];
  undefined8 local_640;
  undefined8 uStack_638;
  undefined8 uStack_630;
  undefined8 uStack_628;
  undefined8 local_620;
  undefined8 uStack_618;
  undefined8 uStack_610;
  undefined8 uStack_608;
  ulong local_600;
  ulong uStack_5f8;
  ulong uStack_5f0;
  ulong uStack_5e8;
  undefined1 local_5e0 [16];
  undefined1 auStack_5d0 [16];
  longlong local_5c0;
  longlong lStack_5b8;
  longlong lStack_5b0;
  longlong lStack_5a8;
  undefined8 local_5a0;
  undefined8 uStack_598;
  undefined8 uStack_590;
  undefined8 uStack_588;
  long local_580;
  long lStack_578;
  long lStack_570;
  long lStack_568;
  longlong local_560;
  longlong lStack_558;
  longlong lStack_550;
  longlong lStack_548;
  ulong local_540;
  ulong uStack_538;
  ulong uStack_530;
  ulong uStack_528;
  undefined1 local_520 [16];
  undefined1 auStack_510 [16];
  longlong local_500;
  longlong lStack_4f8;
  longlong lStack_4f0;
  longlong lStack_4e8;
  undefined8 local_4e0;
  undefined8 uStack_4d8;
  undefined8 uStack_4d0;
  undefined8 uStack_4c8;
  undefined8 local_4c0;
  undefined8 uStack_4b8;
  undefined8 uStack_4b0;
  undefined8 uStack_4a8;
  longlong *local_490;
  longlong *local_488;
  __m256i *local_480;
  longlong *local_478;
  __m256i *local_470;
  __m256i *local_468;
  undefined1 (*local_460) [32];
  __m256i *local_458;
  longlong *local_450;
  longlong *local_448;
  undefined8 local_440;
  undefined8 uStack_438;
  undefined8 uStack_430;
  undefined8 uStack_428;
  ulong local_420;
  ulong uStack_418;
  ulong uStack_410;
  ulong uStack_408;
  undefined8 local_400;
  undefined8 uStack_3f8;
  undefined8 uStack_3f0;
  undefined8 uStack_3e8;
  ulong local_3e0;
  ulong uStack_3d8;
  ulong uStack_3d0;
  ulong uStack_3c8;
  undefined8 local_3c0;
  undefined8 uStack_3b8;
  undefined8 uStack_3b0;
  undefined8 uStack_3a8;
  long local_3a0;
  long lStack_398;
  long lStack_390;
  long lStack_388;
  undefined8 local_380;
  undefined8 uStack_378;
  undefined8 uStack_370;
  undefined8 uStack_368;
  ulong local_360;
  ulong uStack_358;
  ulong uStack_350;
  ulong uStack_348;
  undefined8 local_340;
  undefined8 uStack_338;
  undefined8 uStack_330;
  undefined8 uStack_328;
  longlong local_320;
  longlong lStack_318;
  longlong lStack_310;
  longlong lStack_308;
  long local_300;
  long lStack_2f8;
  long lStack_2f0;
  long lStack_2e8;
  undefined8 local_2e0;
  undefined8 uStack_2d8;
  undefined8 uStack_2d0;
  undefined8 uStack_2c8;
  undefined1 local_2c0 [32];
  long local_2a0;
  long lStack_298;
  long lStack_290;
  long lStack_288;
  undefined8 local_280;
  undefined8 uStack_278;
  undefined8 uStack_270;
  undefined8 uStack_268;
  undefined8 local_260;
  undefined8 uStack_258;
  undefined8 uStack_250;
  undefined8 uStack_248;
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 uStack_230;
  undefined8 uStack_228;
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 uStack_210;
  undefined8 uStack_208;
  undefined1 local_200 [16];
  undefined1 auStack_1f0 [16];
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 uStack_1b0;
  undefined8 uStack_1a8;
  undefined8 local_1a0;
  undefined8 uStack_198;
  undefined8 uStack_190;
  undefined8 uStack_188;
  undefined1 local_180 [32];
  undefined1 local_160 [32];
  undefined8 local_140;
  undefined8 uStack_138;
  undefined8 uStack_130;
  undefined8 uStack_128;
  undefined8 local_120;
  undefined8 uStack_118;
  undefined8 uStack_110;
  undefined8 uStack_108;
  ulong local_100;
  ulong uStack_f8;
  ulong uStack_f0;
  ulong uStack_e8;
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined1 local_c0 [32];
  long local_a0;
  long lStack_98;
  long lStack_90;
  long lStack_88;
  undefined1 local_80 [32];
  undefined8 local_60;
  undefined8 uStack_58;
  longlong lStack_50;
  ulong uStack_48;
  
  local_f24 = 0;
  local_f28 = 0;
  local_f2c = 0;
  local_f30 = 0;
  local_f34 = 0;
  local_f38 = 0;
  local_f40 = 0;
  local_f44 = 0;
  local_f48 = 0;
  local_f4c = 0;
  local_f50 = 0;
  local_f58 = 0;
  local_f60 = (__m256i *)0x0;
  local_f68 = (int64_t *)0x0;
  local_f70 = (__m256i *)0x0;
  local_f78 = (longlong *)0x0;
  local_f80 = (__m256i *)0x0;
  local_fc8 = 0;
  local_fd0 = 0;
  local_1008 = 0;
  local_1128 = (parasail_result_t *)0x0;
  if (in_RDI == 0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_sg_flags_trace_scan_profile_avx2_256_64","profile")
    ;
    local_f00 = (parasail_result_t *)0x0;
  }
  else if (*(long *)(in_RDI + 0x60) == 0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_sg_flags_trace_scan_profile_avx2_256_64",
            "profile->profile64.score");
    local_f00 = (parasail_result_t *)0x0;
  }
  else if (*(long *)(in_RDI + 0x10) == 0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_sg_flags_trace_scan_profile_avx2_256_64",
            "profile->matrix");
    local_f00 = (parasail_result_t *)0x0;
  }
  else if (*(int *)(in_RDI + 8) < 1) {
    fprintf(_stderr,"%s: %s must be > 0\n","parasail_sg_flags_trace_scan_profile_avx2_256_64",
            "profile->s1Len");
    local_f00 = (parasail_result_t *)0x0;
  }
  else if (in_RSI == 0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_sg_flags_trace_scan_profile_avx2_256_64","s2");
    local_f00 = (parasail_result_t *)0x0;
  }
  else if (in_EDX < 1) {
    fprintf(_stderr,"%s: %s must be > 0\n","parasail_sg_flags_trace_scan_profile_avx2_256_64",
            "s2Len");
    local_f00 = (parasail_result_t *)0x0;
  }
  else if (in_ECX < 0) {
    fprintf(_stderr,"%s: %s must be >= 0\n","parasail_sg_flags_trace_scan_profile_avx2_256_64",
            "open");
    local_f00 = (parasail_result_t *)0x0;
  }
  else if (in_R8D < 0) {
    fprintf(_stderr,"%s: %s must be >= 0\n","parasail_sg_flags_trace_scan_profile_avx2_256_64","gap"
           );
    local_f00 = (parasail_result_t *)0x0;
  }
  else {
    local_f24 = 0;
    local_f28 = 0;
    local_f2c = 0;
    local_f30 = *(int *)(in_RDI + 8);
    local_f34 = local_f30 + -1;
    local_f38 = in_EDX + -1;
    local_f40 = *(long *)(in_RDI + 0x10);
    local_f44 = 4;
    local_f48 = (local_f30 + 3) / 4;
    local_f4c = (local_f30 + -1) % (int)local_f48;
    local_f50 = ~((local_f30 + -1) / (int)local_f48) + 4;
    local_f58 = *(long *)(in_RDI + 0x60);
    local_e88 = (ulong)in_ECX;
    auVar43._8_8_ = 0;
    auVar43._0_8_ = local_e88;
    auVar55._8_8_ = 0;
    auVar55._0_8_ = local_e88;
    local_da0 = vpunpcklqdq_avx(auVar43,auVar55);
    auVar56._8_8_ = 0;
    auVar56._0_8_ = local_e88;
    auVar64._8_8_ = 0;
    auVar64._0_8_ = local_e88;
    auStack_d90 = vpunpcklqdq_avx(auVar56,auVar64);
    local_fa0 = local_da0._0_8_;
    uStack_f98 = local_da0._8_8_;
    uStack_f90 = auStack_d90._0_8_;
    uStack_f88 = auStack_d90._8_8_;
    local_e90 = (ulong)in_R8D;
    auVar44._8_8_ = 0;
    auVar44._0_8_ = local_e90;
    auVar57._8_8_ = 0;
    auVar57._0_8_ = local_e90;
    auVar43 = vpunpcklqdq_avx(auVar44,auVar57);
    auVar45._8_8_ = 0;
    auVar45._0_8_ = local_e90;
    auVar65._8_8_ = 0;
    auVar65._0_8_ = local_e90;
    auVar44 = vpunpcklqdq_avx(auVar45,auVar65);
    local_d60._0_16_ = ZEXT116(0) * auVar43 + ZEXT116(1) * auVar44;
    local_d60._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar43;
    if (-in_ECX < *(int *)(local_f40 + 0x20)) {
      lVar41 = (long)in_ECX;
    }
    else {
      lVar41 = -(long)*(int *)(local_f40 + 0x20);
    }
    local_1100 = lVar41 + 0x8000000000000001;
    local_fd0 = 0x7ffffffffffffffe - (long)*(int *)(local_f40 + 0x1c);
    local_e80._8_8_ = SUB328(ZEXT832(0),4);
    local_1000 = 0;
    uStack_ff8 = local_e80._8_8_;
    uStack_ff0 = 0;
    uStack_fe8 = 0;
    auVar46._8_8_ = 0;
    auVar46._0_8_ = local_1100;
    auVar58._8_8_ = 0;
    auVar58._0_8_ = local_1100;
    local_d20 = vpunpcklqdq_avx(auVar46,auVar58);
    auVar59._8_8_ = 0;
    auVar59._0_8_ = local_1100;
    auVar66._8_8_ = 0;
    auVar66._0_8_ = local_1100;
    auStack_d10 = vpunpcklqdq_avx(auVar59,auVar66);
    local_1040 = local_d20._0_8_;
    uStack_1038 = local_d20._8_8_;
    uStack_1030 = auStack_d10._0_8_;
    uStack_1028 = auStack_d10._8_8_;
    auVar47._8_8_ = 0;
    auVar47._0_8_ = local_fd0;
    auVar60._8_8_ = 0;
    auVar60._0_8_ = local_fd0;
    local_ce0 = vpunpcklqdq_avx(auVar47,auVar60);
    auVar61._8_8_ = 0;
    auVar61._0_8_ = local_fd0;
    auVar67._8_8_ = 0;
    auVar67._0_8_ = local_fd0;
    auStack_cd0 = vpunpcklqdq_avx(auVar61,auVar67);
    local_1060 = local_ce0._0_8_;
    uStack_1058 = local_ce0._8_8_;
    uStack_1050 = auStack_cd0._0_8_;
    uStack_1048 = auStack_cd0._8_8_;
    local_1080 = local_ce0._0_8_;
    uStack_1078 = local_ce0._8_8_;
    uStack_1070 = auStack_cd0._0_8_;
    uStack_1068 = auStack_cd0._8_8_;
    local_10a0 = local_d20._0_8_;
    uStack_1098 = local_d20._8_8_;
    uStack_1090 = auStack_d10._0_8_;
    uStack_1088 = auStack_d10._8_8_;
    local_10c0._16_8_ = auStack_d10._0_8_;
    local_10c0._0_16_ = local_d20;
    local_10c0._24_8_ = auStack_d10._8_8_;
    local_ea8 = (ulong)local_f50;
    auVar48._8_8_ = 0;
    auVar48._0_8_ = local_ea8;
    auVar62._8_8_ = 0;
    auVar62._0_8_ = local_ea8;
    local_ca0 = vpunpcklqdq_avx(auVar48,auVar62);
    auVar63._8_8_ = 0;
    auVar63._0_8_ = local_ea8;
    auVar68._8_8_ = 0;
    auVar68._0_8_ = local_ea8;
    auStack_c90 = vpunpcklqdq_avx(auVar63,auVar68);
    local_9a8 = 0;
    local_9b0 = 1;
    local_9b8 = 2;
    local_9c0 = 3;
    local_9e0 = vpunpcklqdq_avx(ZEXT816(3),ZEXT816(2));
    auStack_9d0 = vpunpcklqdq_avx(ZEXT816(1),ZEXT816(0));
    local_dc0 = local_ca0._0_8_;
    lStack_db8 = local_ca0._8_8_;
    lStack_db0 = auStack_c90._0_8_;
    lStack_da8 = auStack_c90._8_8_;
    local_de0 = local_9e0._0_8_;
    lStack_dd8 = local_9e0._8_8_;
    lStack_dd0 = auStack_9d0._0_8_;
    lStack_dc8 = auStack_9d0._8_8_;
    local_10e0 = -(ulong)(local_ca0._0_8_ == local_9e0._0_8_);
    lStack_10d8 = -(ulong)(local_ca0._8_8_ == local_9e0._8_8_);
    lStack_10d0 = -(ulong)(auStack_c90._0_8_ == auStack_9d0._0_8_);
    lStack_10c8 = -(ulong)(auStack_c90._8_8_ == auStack_9d0._8_8_);
    uStack_10f8 = local_e80._8_8_;
    uStack_10f0 = 0;
    uStack_10e8 = 0;
    local_eb0 = (ulong)(int)(-local_f48 * in_R8D);
    auVar49._8_8_ = 0;
    auVar49._0_8_ = local_eb0;
    auVar69._8_8_ = 0;
    auVar69._0_8_ = local_eb0;
    local_c60 = vpunpcklqdq_avx(auVar49,auVar69);
    auVar70._8_8_ = 0;
    auVar70._0_8_ = local_eb0;
    auVar73._8_8_ = 0;
    auVar73._0_8_ = local_eb0;
    auStack_c50 = vpunpcklqdq_avx(auVar70,auVar73);
    auVar1._16_16_ = auStack_c50;
    auVar1._0_16_ = local_c60;
    local_eb8 = (ulong)(int)(-local_f48 * in_R8D);
    auVar71._8_8_ = 0;
    auVar71._0_8_ = local_eb8;
    auVar74._8_8_ = 0;
    auVar74._0_8_ = local_eb8;
    local_c20 = vpunpcklqdq_avx(auVar71,auVar74);
    auVar75._8_8_ = 0;
    auVar75._0_8_ = local_eb8;
    auVar76._8_8_ = 0;
    auVar76._0_8_ = local_eb8;
    auStack_c10 = vpunpcklqdq_avx(auVar75,auVar76);
    auVar2._16_16_ = auStack_c10;
    auVar2._0_16_ = local_c20;
    local_ec0 = (ulong)(int)(-local_f48 * in_R8D);
    auVar72._8_8_ = 0;
    auVar72._0_8_ = local_ec0;
    auVar77._8_8_ = 0;
    auVar77._0_8_ = local_ec0;
    local_be0 = vpunpcklqdq_avx(auVar72,auVar77);
    auVar78._8_8_ = 0;
    auVar78._0_8_ = local_ec0;
    auVar79._8_8_ = 0;
    auVar79._0_8_ = local_ec0;
    local_bd0 = vpunpcklqdq_avx(auVar78,auVar79);
    auVar2 = vperm2i128_avx2(ZEXT1632(local_be0),auVar2,0x28);
    local_860 = vpalignr_avx2(auVar1,auVar2,8);
    uStack_838 = local_e80._8_8_;
    uStack_830 = 0;
    uStack_828 = 0;
    local_1120 = vpaddq_avx2(ZEXT1632(CONCAT88(local_e80._8_8_,local_1100)),local_860);
    local_ec8 = 1;
    local_b68 = 1;
    local_b70 = 1;
    local_b78 = 1;
    local_b80 = 1;
    local_ba0 = vpunpcklqdq_avx(ZEXT816(1),ZEXT816(1));
    auStack_b90 = vpunpcklqdq_avx(ZEXT816(1),ZEXT816(1));
    local_1160 = local_ba0._0_8_;
    uStack_1158 = local_ba0._8_8_;
    uStack_1150 = auStack_b90._0_8_;
    uStack_1148 = auStack_b90._8_8_;
    local_ed0 = 2;
    local_b28 = 2;
    local_b30 = 2;
    local_b38 = 2;
    local_b40 = 2;
    local_b60 = vpunpcklqdq_avx(ZEXT816(2),ZEXT816(2));
    auStack_b50 = vpunpcklqdq_avx(ZEXT816(2),ZEXT816(2));
    local_1180 = local_b60._0_8_;
    uStack_1178 = local_b60._8_8_;
    uStack_1170 = auStack_b50._0_8_;
    uStack_1168 = auStack_b50._8_8_;
    local_ed8 = 4;
    local_ae8 = 4;
    local_af0 = 4;
    local_af8 = 4;
    local_b00 = 4;
    local_b20 = vpunpcklqdq_avx(ZEXT816(4),ZEXT816(4));
    auStack_b10 = vpunpcklqdq_avx(ZEXT816(4),ZEXT816(4));
    local_11a0 = local_b20._0_8_;
    uStack_1198 = local_b20._8_8_;
    uStack_1190 = auStack_b10._0_8_;
    uStack_1188 = auStack_b10._8_8_;
    local_ee0 = 8;
    local_aa8 = 8;
    local_ab0 = 8;
    local_ab8 = 8;
    local_ac0 = 8;
    local_ae0 = vpunpcklqdq_avx(ZEXT816(8),ZEXT816(8));
    auStack_ad0 = vpunpcklqdq_avx(ZEXT816(8),ZEXT816(8));
    local_11c0 = local_ae0._0_8_;
    uStack_11b8 = local_ae0._8_8_;
    uStack_11b0 = auStack_ad0._0_8_;
    uStack_11a8 = auStack_ad0._8_8_;
    local_ee8 = 0x10;
    local_a68 = 0x10;
    local_a70 = 0x10;
    local_a78 = 0x10;
    local_a80 = 0x10;
    local_aa0 = vpunpcklqdq_avx(ZEXT816(0x10),ZEXT816(0x10));
    auStack_a90 = vpunpcklqdq_avx(ZEXT816(0x10),ZEXT816(0x10));
    local_11e0 = local_aa0._0_8_;
    uStack_11d8 = local_aa0._8_8_;
    uStack_11d0 = auStack_a90._0_8_;
    uStack_11c8 = auStack_a90._8_8_;
    local_ef0 = 0x20;
    local_a28 = 0x20;
    local_a30 = 0x20;
    local_a38 = 0x20;
    local_a40 = 0x20;
    local_a60 = vpunpcklqdq_avx(ZEXT816(0x20),ZEXT816(0x20));
    auStack_a50 = vpunpcklqdq_avx(ZEXT816(0x20),ZEXT816(0x20));
    local_1200 = local_a60._0_8_;
    uStack_11f8 = local_a60._8_8_;
    uStack_11f0 = auStack_a50._0_8_;
    uStack_11e8 = auStack_a50._8_8_;
    local_ef8 = 0x40;
    local_9e8 = 0x40;
    local_9f0 = 0x40;
    local_9f8 = 0x40;
    local_a00 = 0x40;
    auVar43 = vpunpcklqdq_avx(ZEXT816(0x40),ZEXT816(0x40));
    auVar44 = vpunpcklqdq_avx(ZEXT816(0x40),ZEXT816(0x40));
    local_a20._0_16_ = ZEXT116(0) * auVar43 + ZEXT116(1) * auVar44;
    local_a20._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar43;
    local_1008 = local_1100;
    local_fc8 = local_1100;
    local_f20 = in_R9D;
    local_f1c = in_R8D;
    local_f18 = in_ECX;
    local_f14 = in_EDX;
    local_f10 = in_RSI;
    local_ea0 = local_fd0;
    local_e98 = local_1100;
    local_e80 = ZEXT832(0) << 0x20;
    local_d80 = local_e88;
    local_d78 = local_e88;
    local_d70 = local_e88;
    local_d68 = local_e88;
    local_d40 = local_e90;
    local_d38 = local_e90;
    local_d30 = local_e90;
    local_d28 = local_e90;
    local_d00 = local_1100;
    local_cf8 = local_1100;
    local_cf0 = local_1100;
    local_ce8 = local_1100;
    local_cc0 = local_fd0;
    local_cb8 = local_fd0;
    local_cb0 = local_fd0;
    local_ca8 = local_fd0;
    local_c80 = local_ea8;
    local_c78 = local_ea8;
    local_c70 = local_ea8;
    local_c68 = local_ea8;
    local_c40 = local_eb0;
    local_c38 = local_eb0;
    local_c30 = local_eb0;
    local_c28 = local_eb0;
    local_c00 = local_eb8;
    local_bf8 = local_eb8;
    local_bf0 = local_eb8;
    local_be8 = local_eb8;
    local_bc0 = local_ec0;
    local_bb8 = local_ec0;
    local_bb0 = local_ec0;
    local_ba8 = local_ec0;
    local_840 = local_1100;
    local_fc0 = local_d60._0_16_;
    auStack_fb0 = local_d60._16_16_;
    local_1220 = local_a20._0_16_;
    auStack_1210 = local_a20._16_16_;
    local_1128 = parasail_result_new_trace(local_f48,in_EDX,0x20,0x20);
    if (local_1128 == (parasail_result_t *)0x0) {
      local_f00 = (parasail_result_t *)0x0;
    }
    else {
      local_1128->flag = local_1128->flag | 0x4880402;
      uVar3 = 0;
      if (local_f20 != 0) {
        uVar3 = 8;
      }
      local_1128->flag = uVar3 | local_1128->flag;
      uVar3 = 0;
      if (in_stack_00000008 != 0) {
        uVar3 = 0x10;
      }
      local_1128->flag = uVar3 | local_1128->flag;
      uVar3 = 0;
      if (s1_end != 0) {
        uVar3 = 0x4000;
      }
      local_1128->flag = uVar3 | local_1128->flag;
      uVar3 = 0;
      if (s2_beg != 0) {
        uVar3 = 0x8000;
      }
      local_1128->flag = uVar3 | local_1128->flag;
      local_f60 = parasail_memalign___m256i(0x20,(long)(int)local_f48);
      local_f68 = parasail_memalign_int64_t(0x20,(long)(local_f14 + 1));
      local_f70 = parasail_memalign___m256i(0x20,(long)(int)local_f48);
      local_f78 = *parasail_memalign___m256i(0x20,(long)(int)local_f48);
      local_f80 = parasail_memalign___m256i(0x20,(long)(int)local_f48);
      if (local_f60 == (__m256i *)0x0) {
        local_f00 = (parasail_result_t *)0x0;
      }
      else if (local_f68 == (int64_t *)0x0) {
        local_f00 = (parasail_result_t *)0x0;
      }
      else if (local_f70 == (__m256i *)0x0) {
        local_f00 = (parasail_result_t *)0x0;
      }
      else if (local_f78 == (longlong *)0x0) {
        local_f00 = (parasail_result_t *)0x0;
      }
      else if (local_f80 == (__m256i *)0x0) {
        local_f00 = (parasail_result_t *)0x0;
      }
      else {
        local_1224 = 0;
        local_f24 = 0;
        while( true ) {
          if ((int)local_f48 <= (int)local_f24) break;
          for (local_1228 = 0; local_1228 < local_f44; local_1228 = local_1228 + 1) {
            if (local_f20 == 0) {
              in_stack_ffffffffffffea94 =
                   -(local_f1c * (local_1228 * local_f48 + local_f24)) - local_f18;
            }
            else {
              in_stack_ffffffffffffea94 = 0;
            }
            uVar42 = (ulong)in_stack_ffffffffffffea94;
            in_stack_ffffffffffffea88 = uVar42;
            if ((long)uVar42 < -0x8000000000000000) {
              in_stack_ffffffffffffea88 = 0x8000000000000000;
            }
            local_1260[local_1228] = in_stack_ffffffffffffea88;
            in_stack_ffffffffffffea80 = uVar42 - (long)local_f18;
            if (in_stack_ffffffffffffea80 < -0x8000000000000000) {
              in_stack_ffffffffffffea80 = -0x8000000000000000;
            }
            local_1280[local_1228] = in_stack_ffffffffffffea80;
          }
          local_668 = local_f78 + (long)local_1224 * 4;
          *local_668 = local_1260[0];
          local_668[1] = local_1260[1];
          local_668[2] = local_1260[2];
          local_668[3] = local_1260[3];
          local_6a8 = local_f60 + local_1224;
          (*local_6a8)[0] = local_1280[0];
          (*local_6a8)[1] = local_1280[1];
          (*local_6a8)[2] = local_1280[2];
          (*local_6a8)[3] = local_1280[3];
          local_1224 = local_1224 + 1;
          local_f24 = local_f24 + 1;
        }
        *local_f68 = 0;
        for (local_f24 = 1; (int)local_f24 <= local_f14; local_f24 = local_f24 + 1) {
          if (s1_end == 0) {
            in_stack_ffffffffffffea7c = -(local_f1c * (local_f24 + -1)) - local_f18;
          }
          else {
            in_stack_ffffffffffffea7c = 0;
          }
          in_stack_ffffffffffffea70 = (long)in_stack_ffffffffffffea7c;
          if (in_stack_ffffffffffffea70 < -0x8000000000000000) {
            in_stack_ffffffffffffea70 = -0x8000000000000000;
          }
          local_f68[(int)local_f24] = in_stack_ffffffffffffea70;
        }
        local_4c0 = local_1000;
        uStack_4b8 = uStack_ff8;
        uStack_4b0 = uStack_ff0;
        uStack_4a8 = uStack_fe8;
        local_4e0 = local_fa0;
        uStack_4d8 = uStack_f98;
        uStack_4d0 = uStack_f90;
        uStack_4c8 = uStack_f88;
        auVar21._8_8_ = uStack_ff8;
        auVar21._0_8_ = local_1000;
        auVar21._16_8_ = uStack_ff0;
        auVar21._24_8_ = uStack_fe8;
        auVar20._8_8_ = uStack_f98;
        auVar20._0_8_ = local_fa0;
        auVar20._16_8_ = uStack_f90;
        auVar20._24_8_ = uStack_f88;
        local_12c0 = vpsubq_avx2(auVar21,auVar20);
        local_f24 = local_f48;
        while( true ) {
          local_f24 = local_f24 - 1;
          if ((int)local_f24 < 0) break;
          local_6e8 = local_f80 + (int)local_f24;
          local_720 = local_12c0._0_8_;
          lStack_718 = local_12c0._8_8_;
          lStack_710 = local_12c0._16_8_;
          lStack_708 = local_12c0._24_8_;
          (*local_6e8)[0] = local_12c0._0_8_;
          (*local_6e8)[1] = local_12c0._8_8_;
          (*local_6e8)[2] = local_12c0._16_8_;
          (*local_6e8)[3] = local_12c0._24_8_;
          local_500 = local_12c0._0_8_;
          lStack_4f8 = local_12c0._8_8_;
          lStack_4f0 = local_12c0._16_8_;
          lStack_4e8 = local_12c0._24_8_;
          auVar19._16_8_ = auStack_fb0._0_8_;
          auVar19._0_16_ = local_fc0;
          auVar19._24_8_ = auStack_fb0._8_8_;
          local_12c0 = vpsubq_avx2(local_12c0,auVar19);
          a[1] = in_stack_ffffffffffffeae0;
          a[0] = in_stack_ffffffffffffead8;
          a[2] = in_stack_ffffffffffffeae8;
          a[3] = in_stack_ffffffffffffeaf0;
          alVar11[1] = in_stack_ffffffffffffeac0._0_8_;
          alVar11[2] = in_stack_ffffffffffffeac0._8_8_;
          alVar11[0] = in_stack_ffffffffffffeab8;
          alVar11[3]._0_4_ = in_stack_ffffffffffffead0;
          alVar11[3]._4_4_ = in_stack_ffffffffffffead4;
          local_520 = local_fc0;
          auStack_510 = auStack_fb0;
          _mm256_min_epi64_rpl(a,alVar11);
        }
        for (local_f28 = 0; local_f28 < local_f14; local_f28 = local_f28 + 1) {
          local_448 = local_f78 + (long)(int)(local_f48 - 1) * 4;
          auVar2 = vpermq_avx2(*(undefined1 (*) [32])local_448,0x90);
          auVar2 = vpblendd_avx2(auVar2,ZEXT1632(ZEXT816(0) << 0x40),3);
          local_13e0 = vpblendd_avx2(auVar2,ZEXT832((ulong)local_f68[local_f28]),3);
          lVar41 = local_f58 +
                   (long)(int)(*(int *)(*(long *)(local_f40 + 0x10) +
                                       (ulong)*(byte *)(local_f10 + local_f28) * 4) * local_f48) *
                   0x20;
          local_560 = (*local_f80)[0];
          lStack_558 = (*local_f80)[1];
          lStack_550 = (*local_f80)[2];
          lStack_548 = (*local_f80)[3];
          local_540 = local_1040;
          uStack_538 = uStack_1038;
          uStack_530 = uStack_1030;
          uStack_528 = uStack_1028;
          auVar18._8_8_ = uStack_1038;
          auVar18._0_8_ = local_1040;
          auVar18._16_8_ = uStack_1030;
          auVar18._24_8_ = uStack_1028;
          local_1340 = vpsubq_avx2(auVar18,(undefined1  [32])*local_f80);
          local_1360._8_8_ = uStack_1038;
          local_1360._0_8_ = local_1040;
          local_1360._16_8_ = uStack_1030;
          local_1360._24_8_ = uStack_1028;
          local_f24 = 0;
          while( true ) {
            if ((int)local_f48 <= (int)local_f24) break;
            local_450 = local_f78 + (long)(int)local_f24 * 4;
            local_580 = *local_450;
            lStack_578 = local_450[1];
            lStack_570 = local_450[2];
            lStack_568 = local_450[3];
            auVar21 = *(undefined1 (*) [32])local_450;
            local_458 = local_f60 + (int)local_f24;
            local_5c0 = (*local_458)[0];
            lStack_5b8 = (*local_458)[1];
            lStack_5b0 = (*local_458)[2];
            lStack_5a8 = (*local_458)[3];
            local_460 = (undefined1 (*) [32])(lVar41 + (long)(int)local_f24 * 0x20);
            uVar4 = *(undefined8 *)*local_460;
            uVar5 = *(undefined8 *)(*local_460 + 8);
            uVar6 = *(undefined8 *)(*local_460 + 0x10);
            uVar7 = *(undefined8 *)(*local_460 + 0x18);
            auVar20 = *local_460;
            local_468 = local_f80 + (int)local_f24;
            auVar38 = *(undefined1 (*) [24])*local_468;
            lVar8 = (*local_468)[3];
            alVar11 = *local_468;
            local_5a0 = local_fa0;
            uStack_598 = uStack_f98;
            uStack_590 = uStack_f90;
            uStack_588 = uStack_f88;
            auVar17._8_8_ = uStack_f98;
            auVar17._0_8_ = local_fa0;
            auVar17._16_8_ = uStack_f90;
            auVar17._24_8_ = uStack_f88;
            auVar2 = vpsubq_avx2(*(undefined1 (*) [32])local_450,auVar17);
            auVar16._16_8_ = auStack_fb0._0_8_;
            auVar16._0_16_ = local_fc0;
            auVar16._24_8_ = auStack_fb0._8_8_;
            auVar1 = vpsubq_avx2((undefined1  [32])*local_458,auVar16);
            local_1320 = auVar2._0_8_;
            lStack_1318 = auVar2._8_8_;
            lStack_1310 = auVar2._16_8_;
            lStack_1308 = auVar2._24_8_;
            local_1300 = auVar1._0_8_;
            uStack_12f8 = auVar1._8_8_;
            uStack_12f0 = auVar1._16_8_;
            uStack_12e8 = auVar1._24_8_;
            local_320 = local_1320;
            lStack_318 = lStack_1318;
            lStack_310 = lStack_1310;
            lStack_308 = lStack_1308;
            local_340 = local_1300;
            uStack_338 = uStack_12f8;
            uStack_330 = uStack_12f0;
            uStack_328 = uStack_12e8;
            auVar2 = vpcmpgtq_avx2(auVar2,auVar1);
            local_1440._0_8_ = auVar2._0_8_;
            local_1440._8_8_ = auVar2._8_8_;
            uStack_1430 = auVar2._16_8_;
            uStack_1428 = auVar2._24_8_;
            local_1a0 = local_11e0;
            uStack_198 = uStack_11d8;
            uStack_190 = uStack_11d0;
            uStack_188 = uStack_11c8;
            local_1c0 = local_11c0;
            uStack_1b8 = uStack_11b8;
            uStack_1b0 = uStack_11b0;
            uStack_1a8 = uStack_11a8;
            local_1e0 = local_1440._0_8_;
            uStack_1d8 = local_1440._8_8_;
            uStack_1d0 = uStack_1430;
            uStack_1c8 = uStack_1428;
            auVar34._8_8_ = uStack_11d8;
            auVar34._0_8_ = local_11e0;
            auVar34._16_8_ = uStack_11d0;
            auVar34._24_8_ = uStack_11c8;
            auVar33._8_8_ = uStack_11b8;
            auVar33._0_8_ = local_11c0;
            auVar33._16_8_ = uStack_11b0;
            auVar33._24_8_ = uStack_11a8;
            vpblendvb_avx2(auVar34,auVar33,auVar2);
            vH_00[0]._4_4_ = in_stack_ffffffffffffea7c;
            vH_00[0]._0_4_ = in_stack_ffffffffffffea78;
            vH_00[1] = in_stack_ffffffffffffea80;
            vH_00[2] = in_stack_ffffffffffffea88;
            vH_00[3]._0_4_ = in_stack_ffffffffffffea90;
            vH_00[3]._4_4_ = in_stack_ffffffffffffea94;
            local_5e0 = local_fc0;
            auStack_5d0 = auStack_fb0;
            arr_store(in_stack_ffffffffffffeab0,vH_00,
                      (int32_t)((ulong)in_stack_ffffffffffffea70 >> 0x20),
                      (int32_t)in_stack_ffffffffffffea70,in_stack_ffffffffffffea6c);
            a_00[1] = in_stack_ffffffffffffeae0;
            a_00[0] = in_stack_ffffffffffffead8;
            a_00[2] = in_stack_ffffffffffffeae8;
            a_00[3] = in_stack_ffffffffffffeaf0;
            b[1] = in_stack_ffffffffffffeac0._0_8_;
            b[2] = in_stack_ffffffffffffeac0._8_8_;
            b[0] = in_stack_ffffffffffffeab8;
            b[3]._0_4_ = in_stack_ffffffffffffead0;
            b[3]._4_4_ = in_stack_ffffffffffffead4;
            _mm256_max_epi64_rpl(a_00,b);
            a_01[1] = in_stack_ffffffffffffeae0;
            a_01[0] = in_stack_ffffffffffffead8;
            a_01[2] = in_stack_ffffffffffffeae8;
            a_01[3] = in_stack_ffffffffffffeaf0;
            b_00[1] = in_stack_ffffffffffffeac0._0_8_;
            b_00[2] = in_stack_ffffffffffffeac0._8_8_;
            b_00[0] = in_stack_ffffffffffffeab8;
            b_00[3]._0_4_ = in_stack_ffffffffffffead0;
            b_00[3]._4_4_ = in_stack_ffffffffffffead4;
            _mm256_min_epi64_rpl(a_01,b_00);
            local_1480 = auVar38._0_8_;
            uStack_1478 = auVar38._8_8_;
            uStack_1470 = auVar38._16_8_;
            local_880 = local_1340._0_8_;
            uStack_878 = local_1340._8_8_;
            uStack_870 = local_1340._16_8_;
            uStack_868 = local_1340._24_8_;
            local_8a0 = local_1480;
            uStack_898 = uStack_1478;
            uStack_890 = uStack_1470;
            vpaddq_avx2(local_1340,(undefined1  [32])alVar11);
            a_02[1] = in_stack_ffffffffffffeae0;
            a_02[0] = in_stack_ffffffffffffead8;
            a_02[2] = in_stack_ffffffffffffeae8;
            a_02[3] = in_stack_ffffffffffffeaf0;
            b_01[1] = in_stack_ffffffffffffeac0._0_8_;
            b_01[2] = in_stack_ffffffffffffeac0._8_8_;
            b_01[0] = in_stack_ffffffffffffeab8;
            b_01[3]._0_4_ = in_stack_ffffffffffffead0;
            b_01[3]._4_4_ = in_stack_ffffffffffffead4;
            lStack_888 = lVar8;
            _mm256_max_epi64_rpl(a_02,b_01);
            local_8c0 = local_13e0._0_8_;
            uStack_8b8 = local_13e0._8_8_;
            uStack_8b0 = local_13e0._16_8_;
            uStack_8a8 = local_13e0._24_8_;
            auVar2 = vpaddq_avx2(local_13e0,auVar20);
            a_03[1] = in_stack_ffffffffffffeae0;
            a_03[0] = in_stack_ffffffffffffead8;
            a_03[2] = in_stack_ffffffffffffeae8;
            a_03[3] = in_stack_ffffffffffffeaf0;
            b_02[1] = in_stack_ffffffffffffeac0._0_8_;
            b_02[2] = in_stack_ffffffffffffeac0._8_8_;
            b_02[0] = in_stack_ffffffffffffeab8;
            b_02[3]._0_4_ = in_stack_ffffffffffffead0;
            b_02[3]._4_4_ = in_stack_ffffffffffffead4;
            local_1340._0_8_ = local_1320;
            local_1340._8_8_ = lStack_1318;
            local_1340._16_8_ = lStack_1310;
            local_1340._24_8_ = lStack_1308;
            local_8e0 = uVar4;
            uStack_8d8 = uVar5;
            uStack_8d0 = uVar6;
            uStack_8c8 = uVar7;
            _mm256_max_epi64_rpl(a_03,b_02);
            local_728 = local_f60 + (int)local_f24;
            (*local_728)[0] = local_1320;
            (*local_728)[1] = lStack_1318;
            (*local_728)[2] = lStack_1310;
            (*local_728)[3] = lStack_1308;
            local_768 = local_f70 + (int)local_f24;
            (*local_768)[0] = local_1340._0_8_;
            (*local_768)[1] = local_1340._8_8_;
            (*local_768)[2] = local_1340._16_8_;
            (*local_768)[3] = local_1340._24_8_;
            local_7a8 = local_f78 + (long)(int)local_f24 * 4;
            local_13e0._0_8_ = auVar2._0_8_;
            local_7e0 = local_13e0._0_8_;
            local_13e0._8_8_ = auVar2._8_8_;
            uStack_7d8 = local_13e0._8_8_;
            local_13e0._16_8_ = auVar2._16_8_;
            uStack_7d0 = local_13e0._16_8_;
            local_13e0._24_8_ = auVar2._24_8_;
            uStack_7c8 = local_13e0._24_8_;
            *local_7a8 = local_13e0._0_8_;
            local_7a8[1] = local_13e0._8_8_;
            local_7a8[2] = local_13e0._16_8_;
            local_7a8[3] = local_13e0._24_8_;
            local_f24 = local_f24 + 1;
            local_13e0 = auVar21;
            local_7a0 = local_1340._0_8_;
            lStack_798 = local_1340._8_8_;
            lStack_790 = local_1340._16_8_;
            lStack_788 = local_1340._24_8_;
            local_760 = local_1320;
            lStack_758 = lStack_1318;
            lStack_750 = lStack_1310;
            lStack_748 = lStack_1308;
          }
          auVar2 = vpermq_avx2(local_1340,0x90);
          auVar2 = vpblendd_avx2(auVar2,ZEXT1632(ZEXT816(0) << 0x40),3);
          auVar2 = vpblendd_avx2(auVar2,ZEXT832((ulong)local_f68[(long)local_f28 + 1]),3);
          local_470 = local_f80;
          auVar38 = *(undefined1 (*) [24])*local_f80;
          lStack_908 = (*local_f80)[3];
          local_1340._0_8_ = auVar2._0_8_;
          local_1340._8_8_ = auVar2._8_8_;
          local_1340._16_8_ = auVar2._16_8_;
          local_1340._24_8_ = auVar2._24_8_;
          local_1480 = auVar38._0_8_;
          uStack_1478 = auVar38._8_8_;
          uStack_1470 = auVar38._16_8_;
          local_900 = local_1340._0_8_;
          uStack_8f8 = local_1340._8_8_;
          uStack_8f0 = local_1340._16_8_;
          uStack_8e8 = local_1340._24_8_;
          local_920 = local_1480;
          uStack_918 = uStack_1478;
          uStack_910 = uStack_1470;
          vpaddq_avx2(auVar2,(undefined1  [32])*local_f80);
          a_04[1] = in_stack_ffffffffffffeae0;
          a_04[0] = in_stack_ffffffffffffead8;
          a_04[2] = in_stack_ffffffffffffeae8;
          a_04[3] = in_stack_ffffffffffffeaf0;
          b_03[1] = in_stack_ffffffffffffeac0._0_8_;
          b_03[2] = in_stack_ffffffffffffeac0._8_8_;
          b_03[0] = in_stack_ffffffffffffeab8;
          b_03[3]._0_4_ = in_stack_ffffffffffffead0;
          b_03[3]._4_4_ = in_stack_ffffffffffffead4;
          _mm256_max_epi64_rpl(a_04,b_03);
          for (local_f24 = 0; (int)local_f24 < local_f44 + -2; local_f24 = local_f24 + 1) {
            auVar2 = vpermq_avx2(local_1360,0x90);
            auVar2 = vpblendd_avx2(auVar2,ZEXT832(0),3);
            local_1500 = auVar2._0_8_;
            uStack_14f8 = auVar2._8_8_;
            uStack_14f0 = auVar2._16_8_;
            uStack_14e8 = auVar2._24_8_;
            local_940 = local_1500;
            uStack_938 = uStack_14f8;
            uStack_930 = uStack_14f0;
            uStack_928 = uStack_14e8;
            local_960 = local_1120._0_8_;
            uStack_958 = local_1120._8_8_;
            uStack_950 = local_1120._16_8_;
            uStack_948 = local_1120._24_8_;
            vpaddq_avx2(auVar2,local_1120);
            a_05[1] = in_stack_ffffffffffffeae0;
            a_05[0] = in_stack_ffffffffffffead8;
            a_05[2] = in_stack_ffffffffffffeae8;
            a_05[3] = in_stack_ffffffffffffeaf0;
            b_04[1] = in_stack_ffffffffffffeac0._0_8_;
            b_04[2] = in_stack_ffffffffffffeac0._8_8_;
            b_04[0] = in_stack_ffffffffffffeab8;
            b_04[3]._0_4_ = in_stack_ffffffffffffead0;
            b_04[3]._4_4_ = in_stack_ffffffffffffead4;
            _mm256_max_epi64_rpl(a_05,b_04);
          }
          auVar2 = vpermq_avx2(local_1360,0x90);
          auVar2 = vpblendd_avx2(auVar2,ZEXT832(0),3);
          local_1360._0_8_ = auVar2._0_8_;
          local_1360._8_8_ = auVar2._8_8_;
          local_1360._16_8_ = auVar2._16_8_;
          local_1360._24_8_ = auVar2._24_8_;
          local_980 = local_1360._0_8_;
          uStack_978 = local_1360._8_8_;
          uStack_970 = local_1360._16_8_;
          uStack_968 = local_1360._24_8_;
          local_9a0 = local_1100;
          uStack_998 = uStack_10f8;
          uStack_990 = uStack_10f0;
          uStack_988 = uStack_10e8;
          auVar12._8_8_ = uStack_10f8;
          auVar12._0_8_ = local_1100;
          auVar12._16_8_ = uStack_10f0;
          auVar12._24_8_ = uStack_10e8;
          auVar2 = vpaddq_avx2(auVar2,auVar12);
          local_1360._0_8_ = auVar2._0_8_;
          local_1360._8_8_ = auVar2._8_8_;
          local_1360._16_8_ = auVar2._16_8_;
          local_1360._24_8_ = auVar2._24_8_;
          a_06[1] = in_stack_ffffffffffffeae0;
          a_06[0] = in_stack_ffffffffffffead8;
          a_06[2] = in_stack_ffffffffffffeae8;
          a_06[3] = in_stack_ffffffffffffeaf0;
          b_05[1] = in_stack_ffffffffffffeac0._0_8_;
          b_05[2] = in_stack_ffffffffffffeac0._8_8_;
          b_05[0] = in_stack_ffffffffffffeab8;
          b_05[3]._0_4_ = in_stack_ffffffffffffead0;
          b_05[3]._4_4_ = in_stack_ffffffffffffead4;
          _mm256_max_epi64_rpl(a_06,b_05);
          local_14c0._0_8_ = local_1360._0_8_;
          local_14c0._8_8_ = local_1360._8_8_;
          uVar42 = local_1360._16_8_;
          uVar52 = local_1360._24_8_;
          local_13c0 = local_1360._0_8_;
          uStack_13b8 = local_1360._8_8_;
          uStack_13b0 = local_1360._16_8_;
          uStack_13a8 = local_1360._24_8_;
          local_1360 = auVar2;
          for (local_f24 = 0; (int)local_f24 < (int)local_f48; local_f24 = local_f24 + 1) {
            arr_load((__m256i *)((local_1128->field_4).rowcols)->score_row,
                     (__m256i *)(ulong)local_f24,local_f48,local_f28,in_R8D);
            local_478 = local_f78 + (long)(int)local_f24 * 4;
            auVar38 = *(undefined1 (*) [24])local_478;
            uVar9 = *(ulong *)*(undefined1 (*) [24])(local_478 + 3);
            local_480 = local_f70 + (int)local_f24;
            auVar39 = *(undefined1 (*) [24])*local_480;
            uVar53 = (*local_480)[3];
            local_600 = local_13c0;
            uStack_5f8 = uStack_13b8;
            uStack_5f0 = uStack_13b0;
            uStack_5e8 = uStack_13a8;
            local_620 = local_fa0;
            uStack_618 = uStack_f98;
            uStack_610 = uStack_f90;
            uStack_608 = uStack_f88;
            auVar15._8_8_ = uStack_13b8;
            auVar15._0_8_ = local_13c0;
            auVar15._16_8_ = uStack_13b0;
            auVar15._24_8_ = uStack_13a8;
            auVar14._8_8_ = uStack_f98;
            auVar14._0_8_ = local_fa0;
            auVar14._16_8_ = uStack_f90;
            auVar14._24_8_ = uStack_f88;
            auVar2 = vpsubq_avx2(auVar15,auVar14);
            local_640 = local_1360._0_8_;
            uStack_638 = local_1360._8_8_;
            uStack_630 = local_1360._16_8_;
            uStack_628 = local_1360._24_8_;
            auVar13._16_8_ = auStack_fb0._0_8_;
            auVar13._0_16_ = local_fc0;
            auVar13._24_8_ = auStack_fb0._8_8_;
            auVar1 = vpsubq_avx2(local_1360,auVar13);
            local_13a0 = auVar2._0_8_;
            uStack_1398 = auVar2._8_8_;
            uStack_1390 = auVar2._16_8_;
            uStack_1388 = auVar2._24_8_;
            a_07[1] = in_stack_ffffffffffffeae0;
            a_07[0] = in_stack_ffffffffffffead8;
            a_07[2] = in_stack_ffffffffffffeae8;
            a_07[3] = in_stack_ffffffffffffeaf0;
            b_06[1] = in_stack_ffffffffffffeac0._0_8_;
            b_06[2] = in_stack_ffffffffffffeac0._8_8_;
            b_06[0] = in_stack_ffffffffffffeab8;
            b_06[3]._0_4_ = in_stack_ffffffffffffead0;
            b_06[3]._4_4_ = in_stack_ffffffffffffead4;
            local_1360._0_8_ = local_13a0;
            local_1360._8_8_ = uStack_1398;
            local_1360._16_8_ = uStack_1390;
            local_1360._24_8_ = uStack_1388;
            local_660 = local_fc0;
            auStack_650 = auStack_fb0;
            _mm256_max_epi64_rpl(a_07,b_06);
            local_1380 = auVar1._0_8_;
            uStack_1378 = auVar1._8_8_;
            uStack_1370 = auVar1._16_8_;
            uStack_1368 = auVar1._24_8_;
            local_360 = local_13a0;
            uStack_358 = uStack_1398;
            uStack_350 = uStack_1390;
            uStack_348 = uStack_1388;
            local_380 = local_1380;
            uStack_378 = uStack_1378;
            uStack_370 = uStack_1370;
            uStack_368 = uStack_1368;
            auVar2 = vpcmpgtq_avx2(auVar2,auVar1);
            local_1440._0_8_ = auVar2._0_8_;
            local_1440._8_8_ = auVar2._8_8_;
            uStack_1430 = auVar2._16_8_;
            uStack_1428 = auVar2._24_8_;
            local_220 = local_1200;
            uStack_218 = uStack_11f8;
            uStack_210 = uStack_11f0;
            uStack_208 = uStack_11e8;
            local_240 = local_1440._0_8_;
            uStack_238 = local_1440._8_8_;
            uStack_230 = uStack_1430;
            uStack_228 = uStack_1428;
            auVar32._16_8_ = auStack_1210._0_8_;
            auVar32._0_16_ = local_1220;
            auVar32._24_8_ = auStack_1210._8_8_;
            auVar31._8_8_ = uStack_11f8;
            auVar31._0_8_ = local_1200;
            auVar31._16_8_ = uStack_11f0;
            auVar31._24_8_ = uStack_11e8;
            auVar2 = vpblendvb_avx2(auVar32,auVar31,auVar2);
            local_1340._0_8_ = auVar39._0_8_;
            local_1340._8_8_ = auVar39._8_8_;
            local_1340._16_8_ = auVar39._16_8_;
            a_08[1] = in_stack_ffffffffffffeae0;
            a_08[0] = in_stack_ffffffffffffead8;
            a_08[2] = in_stack_ffffffffffffeae8;
            a_08[3] = in_stack_ffffffffffffeaf0;
            b_07[1] = in_stack_ffffffffffffeac0._0_8_;
            b_07[2] = in_stack_ffffffffffffeac0._8_8_;
            b_07[0] = in_stack_ffffffffffffeab8;
            b_07[3]._0_4_ = in_stack_ffffffffffffead0;
            b_07[3]._4_4_ = in_stack_ffffffffffffead4;
            local_200 = local_1220;
            auStack_1f0 = auStack_1210;
            _mm256_max_epi64_rpl(a_08,b_07);
            local_13e0._0_8_ = auVar38._0_8_;
            local_13e0._8_8_ = auVar38._8_8_;
            local_13e0._16_8_ = auVar38._16_8_;
            local_e20 = local_13e0._0_8_;
            uStack_e18 = local_13e0._8_8_;
            uStack_e10 = local_13e0._16_8_;
            local_300 = -(ulong)(local_1340._0_8_ == local_13e0._0_8_);
            lStack_2f8 = -(ulong)(local_1340._8_8_ == local_13e0._8_8_);
            lStack_2f0 = -(ulong)(local_1340._16_8_ == local_13e0._16_8_);
            lStack_2e8 = -(ulong)(uVar53 == uVar9);
            local_1440._8_8_ = lStack_2f8;
            local_1440._0_8_ = local_300;
            local_2a0 = -(ulong)(local_1340._0_8_ == local_1360._0_8_);
            lStack_298 = -(ulong)(local_1340._8_8_ == local_1360._8_8_);
            lStack_290 = -(ulong)(local_1340._16_8_ == local_1360._16_8_);
            lStack_288 = -(ulong)(uVar53 == local_1360._24_8_);
            local_260 = local_1160;
            uStack_258 = uStack_1158;
            uStack_250 = uStack_1150;
            uStack_248 = uStack_1148;
            local_280 = local_1180;
            uStack_278 = uStack_1178;
            uStack_270 = uStack_1170;
            uStack_268 = uStack_1168;
            auVar30._8_8_ = uStack_1158;
            auVar30._0_8_ = local_1160;
            auVar30._16_8_ = uStack_1150;
            auVar30._24_8_ = uStack_1148;
            auVar29._8_8_ = uStack_1178;
            auVar29._0_8_ = local_1180;
            auVar29._16_8_ = uStack_1170;
            auVar29._24_8_ = uStack_1168;
            auVar28._8_8_ = lStack_298;
            auVar28._0_8_ = local_2a0;
            auVar28._16_8_ = lStack_290;
            auVar28._24_8_ = lStack_288;
            local_2c0 = vpblendvb_avx2(auVar30,auVar29,auVar28);
            local_2e0 = local_11a0;
            uStack_2d8 = uStack_1198;
            uStack_2d0 = uStack_1190;
            uStack_2c8 = uStack_1188;
            auVar27._8_8_ = uStack_1198;
            auVar27._0_8_ = local_11a0;
            auVar27._16_8_ = uStack_1190;
            auVar27._24_8_ = uStack_1188;
            auVar26._16_8_ = lStack_2f0;
            auVar26._0_16_ = local_1440;
            auVar26._24_8_ = lStack_2e8;
            auVar1 = vpblendvb_avx2(local_2c0,auVar27,auVar26);
            local_14a0 = auVar1._0_8_;
            uStack_1498 = auVar1._8_8_;
            uStack_1490 = auVar1._16_8_;
            uStack_1488 = auVar1._24_8_;
            local_e0 = local_14a0;
            uStack_d8 = uStack_1498;
            uStack_d0 = uStack_1490;
            uStack_c8 = uStack_1488;
            auVar35._16_8_ = uVar42;
            auVar35._0_16_ = local_14c0;
            auVar35._24_8_ = uVar52;
            auVar1 = vpor_avx2(auVar1,auVar35);
            local_14a0 = auVar1._0_8_;
            uStack_1498 = auVar1._8_8_;
            uStack_1490 = auVar1._16_8_;
            uStack_1488 = auVar1._24_8_;
            local_14e0 = auVar2._0_8_;
            uStack_14d8 = auVar2._8_8_;
            uStack_14d0 = auVar2._16_8_;
            uStack_14c8 = auVar2._24_8_;
            local_120 = local_14a0;
            uStack_118 = uStack_1498;
            uStack_110 = uStack_1490;
            uStack_108 = uStack_1488;
            local_140 = local_14e0;
            uStack_138 = uStack_14d8;
            uStack_130 = uStack_14d0;
            uStack_128 = uStack_14c8;
            vpor_avx2(auVar1,auVar2);
            vH_01[0]._4_4_ = in_stack_ffffffffffffea7c;
            vH_01[0]._0_4_ = in_stack_ffffffffffffea78;
            vH_01[1] = in_stack_ffffffffffffea80;
            vH_01[2] = in_stack_ffffffffffffea88;
            vH_01[3]._0_4_ = in_stack_ffffffffffffea90;
            vH_01[3]._4_4_ = in_stack_ffffffffffffea94;
            local_e60 = local_1360._0_8_;
            uStack_e58 = local_1360._8_8_;
            uStack_e50 = local_1360._16_8_;
            uStack_e48 = local_1360._24_8_;
            local_e40 = local_1340._0_8_;
            uStack_e38 = local_1340._8_8_;
            uStack_e30 = local_1340._16_8_;
            uStack_e28 = uVar53;
            uStack_e08 = uVar9;
            local_e00 = local_1340._0_8_;
            uStack_df8 = local_1340._8_8_;
            uStack_df0 = local_1340._16_8_;
            uStack_de8 = uVar53;
            local_100 = local_14c0._0_8_;
            uStack_f8 = local_14c0._8_8_;
            uStack_f0 = uVar42;
            uStack_e8 = uVar52;
            arr_store(in_stack_ffffffffffffeab0,vH_01,
                      (int32_t)((ulong)in_stack_ffffffffffffea70 >> 0x20),
                      (int32_t)in_stack_ffffffffffffea70,in_stack_ffffffffffffea6c);
            local_7e8 = local_f78 + (long)(int)local_f24 * 4;
            *local_7e8 = local_1340._0_8_;
            local_7e8[1] = local_1340._8_8_;
            local_7e8[2] = local_1340._16_8_;
            local_7e8[3] = uVar53;
            a_09[1] = in_stack_ffffffffffffeae0;
            a_09[0] = in_stack_ffffffffffffead8;
            a_09[2] = in_stack_ffffffffffffeae8;
            a_09[3] = in_stack_ffffffffffffeaf0;
            b_08[1] = in_stack_ffffffffffffeac0._0_8_;
            b_08[2] = in_stack_ffffffffffffeac0._8_8_;
            b_08[0] = in_stack_ffffffffffffeab8;
            b_08[3]._0_4_ = in_stack_ffffffffffffead0;
            b_08[3]._4_4_ = in_stack_ffffffffffffead4;
            local_820 = local_1340._0_8_;
            uStack_818 = local_1340._8_8_;
            uStack_810 = local_1340._16_8_;
            uStack_808 = uVar53;
            _mm256_min_epi64_rpl(a_09,b_08);
            a_10[1] = in_stack_ffffffffffffeae0;
            a_10[0] = in_stack_ffffffffffffead8;
            a_10[2] = in_stack_ffffffffffffeae8;
            a_10[3] = in_stack_ffffffffffffeaf0;
            b_09[1] = in_stack_ffffffffffffeac0._0_8_;
            b_09[2] = in_stack_ffffffffffffeac0._8_8_;
            b_09[0] = in_stack_ffffffffffffeab8;
            b_09[3]._0_4_ = in_stack_ffffffffffffead0;
            b_09[3]._4_4_ = in_stack_ffffffffffffead4;
            _mm256_min_epi64_rpl(a_10,b_09);
            a_11[1] = in_stack_ffffffffffffeae0;
            a_11[0] = in_stack_ffffffffffffead8;
            a_11[2] = in_stack_ffffffffffffeae8;
            a_11[3] = in_stack_ffffffffffffeaf0;
            b_10[1] = in_stack_ffffffffffffeac0._0_8_;
            b_10[2] = in_stack_ffffffffffffeac0._8_8_;
            b_10[0] = in_stack_ffffffffffffeab8;
            b_10[3]._0_4_ = in_stack_ffffffffffffead0;
            b_10[3]._4_4_ = in_stack_ffffffffffffead4;
            local_14c0._0_8_ = local_10a0;
            local_14c0._8_8_ = uStack_1098;
            uVar42 = uStack_1090;
            uVar52 = uStack_1088;
            _mm256_max_epi64_rpl(a_11,b_10);
            local_13c0 = local_1340._0_8_;
            uStack_13b8 = local_1340._8_8_;
            uStack_13b0 = local_1340._16_8_;
            uStack_13a8 = uVar53;
            local_10a0 = local_14c0._0_8_;
            uStack_1098 = local_14c0._8_8_;
            uStack_1090 = uVar42;
            uStack_1088 = uVar52;
          }
          local_488 = local_f78 + (long)local_f4c * 4;
          lVar41 = *local_488;
          lVar50 = local_488[1];
          lVar51 = local_488[2];
          lVar54 = local_488[3];
          local_3c0 = local_10c0._0_8_;
          uStack_3b8 = local_10c0._8_8_;
          uStack_3b0 = local_10c0._16_8_;
          uStack_3a8 = local_10c0._24_8_;
          local_c0 = vpcmpgtq_avx2(*(undefined1 (*) [32])local_488,local_10c0);
          local_a0 = local_10e0;
          lStack_98 = lStack_10d8;
          lStack_90 = lStack_10d0;
          lStack_88 = lStack_10c8;
          auVar36._8_8_ = lStack_10d8;
          auVar36._0_8_ = local_10e0;
          auVar36._16_8_ = lStack_10d0;
          auVar36._24_8_ = lStack_10c8;
          auVar2 = vpand_avx2(auVar36,local_c0);
          in_stack_ffffffffffffeae0 = auVar2._0_8_;
          in_stack_ffffffffffffeae8 = auVar2._8_8_;
          in_stack_ffffffffffffeaf0 = auVar2._16_8_;
          uStack_1508 = auVar2._24_8_;
          a_12[1] = in_stack_ffffffffffffeae0;
          a_12[0] = in_stack_ffffffffffffead8;
          a_12[2] = in_stack_ffffffffffffeae8;
          a_12[3] = in_stack_ffffffffffffeaf0;
          b_11[1] = in_stack_ffffffffffffeac0._0_8_;
          b_11[2] = in_stack_ffffffffffffeac0._8_8_;
          b_11[0] = in_stack_ffffffffffffeab8;
          b_11[3]._0_4_ = in_stack_ffffffffffffead0;
          b_11[3]._4_4_ = in_stack_ffffffffffffead4;
          local_3a0 = lVar41;
          lStack_398 = lVar50;
          lStack_390 = lVar51;
          lStack_388 = lVar54;
          _mm256_max_epi64_rpl(a_12,b_11);
          local_10c0._8_8_ = lVar50;
          local_10c0._0_8_ = lVar41;
          local_10c0._16_8_ = lVar51;
          local_10c0._24_8_ = lVar54;
          uStack_48 = uStack_1508;
          auVar37._8_8_ = in_stack_ffffffffffffeae8;
          auVar37._0_8_ = in_stack_ffffffffffffeae0;
          auVar37._16_8_ = in_stack_ffffffffffffeaf0;
          auVar37._24_8_ = uStack_1508;
          if ((((((((((((((((((((((((((((((((auVar37 >> 7 & (undefined1  [32])0x1) !=
                                            (undefined1  [32])0x0 ||
                                           (auVar37 >> 0xf & (undefined1  [32])0x1) !=
                                           (undefined1  [32])0x0) ||
                                          (auVar37 >> 0x17 & (undefined1  [32])0x1) !=
                                          (undefined1  [32])0x0) ||
                                         (auVar37 >> 0x1f & (undefined1  [32])0x1) !=
                                         (undefined1  [32])0x0) ||
                                        (auVar37 >> 0x27 & (undefined1  [32])0x1) !=
                                        (undefined1  [32])0x0) ||
                                       (auVar37 >> 0x2f & (undefined1  [32])0x1) !=
                                       (undefined1  [32])0x0) ||
                                      (auVar37 >> 0x37 & (undefined1  [32])0x1) !=
                                      (undefined1  [32])0x0) ||
                                     (auVar37 >> 0x3f & (undefined1  [32])0x1) !=
                                     (undefined1  [32])0x0) ||
                                    (auVar37 >> 0x47 & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) ||
                                   (auVar37 >> 0x4f & (undefined1  [32])0x1) !=
                                   (undefined1  [32])0x0) ||
                                  (auVar37 >> 0x57 & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                  ) || (auVar37 >> 0x5f & (undefined1  [32])0x1) !=
                                       (undefined1  [32])0x0) ||
                                (auVar37 >> 0x67 & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                               || (auVar37 >> 0x6f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               ) || (auVar37 >> 0x77 & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) || SUB321(auVar37 >> 0x7f,0) != '\0') ||
                            (auVar37 >> 0x87 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           (auVar37 >> 0x8f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar37 >> 0x97 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar37 >> 0x9f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar37 >> 0xa7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       (auVar37 >> 0xaf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar37 >> 0xb7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar37 >> 0xbf,0) != '\0') || (uStack_1508 >> 7 & 1) != 0) ||
                   (uStack_1508 >> 0xf & 1) != 0) || (uStack_1508 >> 0x17 & 1) != 0) ||
                 (uStack_1508 >> 0x1f & 1) != 0) || (uStack_1508 >> 0x27 & 1) != 0) ||
               (uStack_1508 >> 0x2f & 1) != 0) || (uStack_1508 >> 0x37 & 1) != 0) ||
              (long)uStack_1508 < 0) {
            local_f38 = local_f28;
          }
          local_60 = in_stack_ffffffffffffeae0;
          uStack_58 = in_stack_ffffffffffffeae8;
          lStack_50 = in_stack_ffffffffffffeaf0;
        }
        if (s2_beg != 0) {
          for (local_f2c = 0; local_f2c < local_f50; local_f2c = local_f2c + 1) {
            auVar2 = vpermq_avx2(local_10c0,0x90);
            local_10c0 = vpblendd_avx2(auVar2,ZEXT1632(ZEXT816(0) << 0x40),3);
          }
          local_1008 = local_10c0._24_8_;
          local_f34 = local_f30 + -1;
        }
        if (in_stack_00000008 != 0) {
          plVar80 = local_f78;
          for (local_f24 = 0; (int)local_f24 < (int)(local_f48 * local_f44);
              local_f24 = local_f24 + 1) {
            iVar40 = (int)local_f24 / local_f44 + ((int)local_f24 % local_f44) * local_f48;
            if (iVar40 < local_f30) {
              if ((long)local_1008 < *plVar80) {
                local_1008 = *plVar80;
                local_f38 = local_f14 + -1;
                local_f34 = iVar40;
              }
              else if (((*plVar80 == local_1008) && (local_f38 == local_f14 + -1)) &&
                      (iVar40 < local_f34)) {
                local_f34 = iVar40;
              }
            }
            plVar80 = plVar80 + 1;
          }
        }
        if ((in_stack_00000008 == 0) && (s2_beg == 0)) {
          local_490 = local_f78 + (long)local_f4c * 4;
          local_1560 = *local_490;
          uStack_1558 = local_490[1];
          uVar42 = local_490[2];
          local_1008 = local_490[3];
          for (local_f2c = 0; local_f2c < local_f50; local_f2c = local_f2c + 1) {
            auVar10._8_8_ = uStack_1558;
            auVar10._0_8_ = local_1560;
            auVar10._16_8_ = uVar42;
            auVar10._24_8_ = local_1008;
            auVar2 = vpermq_avx2(auVar10,0x90);
            auVar2 = vpblendd_avx2(auVar2,ZEXT1632(ZEXT816(0) << 0x40),3);
            local_1560 = auVar2._0_8_;
            uStack_1558 = auVar2._8_8_;
            uVar42 = auVar2._16_8_;
            local_1008 = auVar2._24_8_;
          }
          local_f38 = local_f14 + -1;
          local_f34 = local_f30 + -1;
        }
        local_3e0 = local_1040;
        uStack_3d8 = uStack_1038;
        uStack_3d0 = uStack_1030;
        uStack_3c8 = uStack_1028;
        local_400 = local_1080;
        uStack_3f8 = uStack_1078;
        uStack_3f0 = uStack_1070;
        uStack_3e8 = uStack_1068;
        auVar25._8_8_ = uStack_1038;
        auVar25._0_8_ = local_1040;
        auVar25._16_8_ = uStack_1030;
        auVar25._24_8_ = uStack_1028;
        auVar24._8_8_ = uStack_1078;
        auVar24._0_8_ = local_1080;
        auVar24._16_8_ = uStack_1070;
        auVar24._24_8_ = uStack_1068;
        local_160 = vpcmpgtq_avx2(auVar25,auVar24);
        local_420 = local_10a0;
        uStack_418 = uStack_1098;
        uStack_410 = uStack_1090;
        uStack_408 = uStack_1088;
        local_440 = local_1060;
        uStack_438 = uStack_1058;
        uStack_430 = uStack_1050;
        uStack_428 = uStack_1048;
        auVar23._8_8_ = uStack_1098;
        auVar23._0_8_ = local_10a0;
        auVar23._16_8_ = uStack_1090;
        auVar23._24_8_ = uStack_1088;
        auVar22._8_8_ = uStack_1058;
        auVar22._0_8_ = local_1060;
        auVar22._16_8_ = uStack_1050;
        auVar22._24_8_ = uStack_1048;
        local_180 = vpcmpgtq_avx2(auVar23,auVar22);
        local_80 = vpor_avx2(local_160,local_180);
        if ((((((((((((((((((((((((((((((((local_80 >> 7 & (undefined1  [32])0x1) !=
                                          (undefined1  [32])0x0 ||
                                         (local_80 >> 0xf & (undefined1  [32])0x1) !=
                                         (undefined1  [32])0x0) ||
                                        (local_80 >> 0x17 & (undefined1  [32])0x1) !=
                                        (undefined1  [32])0x0) ||
                                       (local_80 >> 0x1f & (undefined1  [32])0x1) !=
                                       (undefined1  [32])0x0) ||
                                      (local_80 >> 0x27 & (undefined1  [32])0x1) !=
                                      (undefined1  [32])0x0) ||
                                     (local_80 >> 0x2f & (undefined1  [32])0x1) !=
                                     (undefined1  [32])0x0) ||
                                    (local_80 >> 0x37 & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) ||
                                   (local_80 >> 0x3f & (undefined1  [32])0x1) !=
                                   (undefined1  [32])0x0) ||
                                  (local_80 >> 0x47 & (undefined1  [32])0x1) !=
                                  (undefined1  [32])0x0) ||
                                 (local_80 >> 0x4f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                 ) || (local_80 >> 0x57 & (undefined1  [32])0x1) !=
                                      (undefined1  [32])0x0) ||
                               (local_80 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                              || (local_80 >> 0x67 & (undefined1  [32])0x1) != (undefined1  [32])0x0
                              ) || (local_80 >> 0x6f & (undefined1  [32])0x1) !=
                                   (undefined1  [32])0x0) ||
                            (local_80 >> 0x77 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           SUB321(local_80 >> 0x7f,0) != '\0') ||
                          (local_80 >> 0x87 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (local_80 >> 0x8f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (local_80 >> 0x97 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       (local_80 >> 0x9f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (local_80 >> 0xa7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     (local_80 >> 0xaf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (local_80 >> 0xb7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(local_80 >> 0xbf,0) != '\0') ||
                  (local_80 >> 199 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 (local_80 >> 0xcf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (local_80 >> 0xd7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               (local_80 >> 0xdf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (local_80 >> 0xe7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             (local_80 >> 0xef & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (local_80 >> 0xf7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            local_80[0x1f] < '\0') {
          local_1128->flag = local_1128->flag | 0x40;
          local_1008 = 0;
          local_f34 = 0;
          local_f38 = 0;
        }
        local_1128->score = (int)local_1008;
        local_1128->end_query = local_f34;
        local_1128->end_ref = local_f38;
        parasail_free(local_f80);
        parasail_free(local_f78);
        parasail_free(local_f70);
        parasail_free(local_f68);
        parasail_free(local_f60);
        local_f00 = local_1128;
      }
    }
  }
  return local_f00;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap,
        int s1_beg, int s1_end, int s2_beg, int s2_end)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t s1Len = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    int32_t offset = 0;
    int32_t position = 0;
    __m256i* restrict pvP = NULL;
    __m256i* restrict pvE = NULL;
    int64_t* restrict boundary = NULL;
    __m256i* restrict pvHt = NULL;
    __m256i* restrict pvH = NULL;
    __m256i* restrict pvGapper = NULL;
    __m256i vGapO;
    __m256i vGapE;
    int64_t NEG_LIMIT = 0;
    int64_t POS_LIMIT = 0;
    __m256i vZero;
    int64_t score = 0;
    __m256i vNegLimit;
    __m256i vPosLimit;
    __m256i vSaturationCheckMin;
    __m256i vSaturationCheckMax;
    __m256i vMaxH;
    __m256i vPosMask;
    __m256i vNegInfFront;
    __m256i vSegLenXgap;
    parasail_result_t *result = NULL;
    __m256i vTIns;
    __m256i vTDel;
    __m256i vTDiag;
    __m256i vTDiagE;
    __m256i vTInsE;
    __m256i vTDiagF;
    __m256i vTDelF;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile64.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    s1Len = profile->s1Len;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    matrix = profile->matrix;
    segWidth = 4; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
    pvP = (__m256i*)profile->profile64.score;
    vGapO = _mm256_set1_epi64x_rpl(open);
    vGapE = _mm256_set1_epi64x_rpl(gap);
    NEG_LIMIT = (-open < matrix->min ? INT64_MIN + open : INT64_MIN - matrix->min) + 1;
    POS_LIMIT = INT64_MAX - matrix->max - 1;
    vZero = _mm256_setzero_si256();
    score = NEG_LIMIT;
    vNegLimit = _mm256_set1_epi64x_rpl(NEG_LIMIT);
    vPosLimit = _mm256_set1_epi64x_rpl(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vMaxH = vNegLimit;
    vPosMask = _mm256_cmpeq_epi64(_mm256_set1_epi64x_rpl(position),
            _mm256_set_epi64x_rpl(0,1,2,3));
    vNegInfFront = vZero;
    vNegInfFront = _mm256_insert_epi64_rpl(vNegInfFront, NEG_LIMIT, 0);
    vSegLenXgap = _mm256_add_epi64(vNegInfFront,
            _mm256_slli_si256_rpl(_mm256_set1_epi64x_rpl(-segLen*gap), 8));
    vTIns  = _mm256_set1_epi64x_rpl(PARASAIL_INS);
    vTDel  = _mm256_set1_epi64x_rpl(PARASAIL_DEL);
    vTDiag = _mm256_set1_epi64x_rpl(PARASAIL_DIAG);
    vTDiagE= _mm256_set1_epi64x_rpl(PARASAIL_DIAG_E);
    vTInsE = _mm256_set1_epi64x_rpl(PARASAIL_INS_E);
    vTDiagF= _mm256_set1_epi64x_rpl(PARASAIL_DIAG_F);
    vTDelF = _mm256_set1_epi64x_rpl(PARASAIL_DEL_F);

    /* initialize result */
    result = parasail_result_new_trace(segLen, s2Len, 32, sizeof(__m256i));
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SG | PARASAIL_FLAG_SCAN
        | PARASAIL_FLAG_TRACE
        | PARASAIL_FLAG_BITS_64 | PARASAIL_FLAG_LANES_4;
    result->flag |= s1_beg ? PARASAIL_FLAG_SG_S1_BEG : 0;
    result->flag |= s1_end ? PARASAIL_FLAG_SG_S1_END : 0;
    result->flag |= s2_beg ? PARASAIL_FLAG_SG_S2_BEG : 0;
    result->flag |= s2_end ? PARASAIL_FLAG_SG_S2_END : 0;

    /* initialize heap variables */
    pvE = parasail_memalign___m256i(32, segLen);
    boundary = parasail_memalign_int64_t(32, s2Len+1);
    pvHt= parasail_memalign___m256i(32, segLen);
    pvH = parasail_memalign___m256i(32, segLen);
    pvGapper = parasail_memalign___m256i(32, segLen);

    /* validate heap variables */
    if (!pvE) return NULL;
    if (!boundary) return NULL;
    if (!pvHt) return NULL;
    if (!pvH) return NULL;
    if (!pvGapper) return NULL;

    /* initialize H and E */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            int32_t segNum = 0;
            __m256i_64_t h;
            __m256i_64_t e;
            for (segNum=0; segNum<segWidth; ++segNum) {
                int64_t tmp = s1_beg ? 0 : (-open-gap*(segNum*segLen+i));
                h.v[segNum] = tmp < INT64_MIN ? INT64_MIN : tmp;
                tmp = tmp - open;
                e.v[segNum] = tmp < INT64_MIN ? INT64_MIN : tmp;
            }
            _mm256_store_si256(&pvH[index], h.m);
            _mm256_store_si256(&pvE[index], e.m);
            ++index;
        }
    }

    /* initialize uppder boundary */
    {
        boundary[0] = 0;
        for (i=1; i<=s2Len; ++i) {
            int64_t tmp = s2_beg ? 0 : (-open-gap*(i-1));
            boundary[i] = tmp < INT64_MIN ? INT64_MIN : tmp;
        }
    }

    {
        __m256i vGapper = _mm256_sub_epi64(vZero,vGapO);
        for (i=segLen-1; i>=0; --i) {
            _mm256_store_si256(pvGapper+i, vGapper);
            vGapper = _mm256_sub_epi64(vGapper, vGapE);
            /* long queries and/or large penalties will break the pseudo prefix scan */
            vSaturationCheckMin = _mm256_min_epi64_rpl(vSaturationCheckMin, vGapper);
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m256i vE;
        __m256i vE_ext;
        __m256i vE_opn;
        __m256i vHt;
        __m256i vF;
        __m256i vF_ext;
        __m256i vF_opn;
        __m256i vH;
        __m256i vHp;
        __m256i *pvW;
        __m256i vW;
        __m256i case1;
        __m256i case2;
        __m256i vGapper;
        __m256i vT;
        __m256i vET;
        __m256i vFT;

        /* calculate E */
        /* calculate Ht */
        /* calculate F and H first pass */
        vHp = _mm256_load_si256(pvH+(segLen-1));
        vHp = _mm256_slli_si256_rpl(vHp, 8);
        vHp = _mm256_insert_epi64_rpl(vHp, boundary[j], 0);
        pvW = pvP + matrix->mapper[(unsigned char)s2[j]]*segLen;
        vHt = _mm256_sub_epi64(vNegLimit, pvGapper[0]);
        vF = vNegLimit;
        for (i=0; i<segLen; ++i) {
            vH = _mm256_load_si256(pvH+i);
            vE = _mm256_load_si256(pvE+i);
            vW = _mm256_load_si256(pvW+i);
            vGapper = _mm256_load_si256(pvGapper+i);
            vE_opn = _mm256_sub_epi64(vH, vGapO);
            vE_ext = _mm256_sub_epi64(vE, vGapE);
            case1 = _mm256_cmpgt_epi64(vE_opn, vE_ext);
            vET = _mm256_blendv_epi8(vTInsE, vTDiagE, case1);
            arr_store(result->trace->trace_table, vET, i, segLen, j);
            vE = _mm256_max_epi64_rpl(vE_opn, vE_ext);
            vSaturationCheckMin = _mm256_min_epi64_rpl(vSaturationCheckMin, vE);
            vGapper = _mm256_add_epi64(vHt, vGapper);
            vF = _mm256_max_epi64_rpl(vF, vGapper);
            vHp = _mm256_add_epi64(vHp, vW);
            vHt = _mm256_max_epi64_rpl(vE, vHp);
            _mm256_store_si256(pvE+i, vE);
            _mm256_store_si256(pvHt+i, vHt);
            _mm256_store_si256(pvH+i, vHp);
            vHp = vH;
        }

        /* pseudo prefix scan on F and H */
        vHt = _mm256_slli_si256_rpl(vHt, 8);
        vHt = _mm256_insert_epi64_rpl(vHt, boundary[j+1], 0);
        vGapper = _mm256_load_si256(pvGapper);
        vGapper = _mm256_add_epi64(vHt, vGapper);
        vF = _mm256_max_epi64_rpl(vF, vGapper);
        for (i=0; i<segWidth-2; ++i) {
            __m256i vFt = _mm256_slli_si256_rpl(vF, 8);
            vFt = _mm256_add_epi64(vFt, vSegLenXgap);
            vF = _mm256_max_epi64_rpl(vF, vFt);
        }

        /* calculate final H */
        vF = _mm256_slli_si256_rpl(vF, 8);
        vF = _mm256_add_epi64(vF, vNegInfFront);
        vH = _mm256_max_epi64_rpl(vF, vHt);
        for (i=0; i<segLen; ++i) {
            vET = arr_load(result->trace->trace_table, i, segLen, j);
            vHp = _mm256_load_si256(pvH+i);
            vHt = _mm256_load_si256(pvHt+i);
            vF_opn = _mm256_sub_epi64(vH, vGapO);
            vF_ext = _mm256_sub_epi64(vF, vGapE);
            vF = _mm256_max_epi64_rpl(vF_opn, vF_ext);
            case1 = _mm256_cmpgt_epi64(vF_opn, vF_ext);
            vFT = _mm256_blendv_epi8(vTDelF, vTDiagF, case1);
            vH = _mm256_max_epi64_rpl(vHt, vF);
            case1 = _mm256_cmpeq_epi64(vH, vHp);
            case2 = _mm256_cmpeq_epi64(vH, vF);
            vT = _mm256_blendv_epi8(
                    _mm256_blendv_epi8(vTIns, vTDel, case2),
                    vTDiag, case1);
            vT = _mm256_or_si256(vT, vET);
            vT = _mm256_or_si256(vT, vFT);
            arr_store(result->trace->trace_table, vT, i, segLen, j);
            _mm256_store_si256(pvH+i, vH);
            vSaturationCheckMin = _mm256_min_epi64_rpl(vSaturationCheckMin, vH);
            vSaturationCheckMin = _mm256_min_epi64_rpl(vSaturationCheckMin, vF);
            vSaturationCheckMax = _mm256_max_epi64_rpl(vSaturationCheckMax, vH);
        }

        /* extract vector containing last value from column */
        {
            __m256i vCompare;
            vH = _mm256_load_si256(pvH + offset);
            vCompare = _mm256_and_si256(vPosMask, _mm256_cmpgt_epi64(vH, vMaxH));
            vMaxH = _mm256_max_epi64_rpl(vH, vMaxH);
            if (_mm256_movemask_epi8(vCompare)) {
                end_ref = j;
            }
        }
    } 

    /* max last value from all columns */
    if (s2_end)
    {
        for (k=0; k<position; ++k) {
            vMaxH = _mm256_slli_si256_rpl(vMaxH, 8);
        }
        score = (int64_t) _mm256_extract_epi64_rpl(vMaxH, 3);
        end_query = s1Len-1;
    }

    /* max of last column */
    if (s1_end)
    {
        /* Trace the alignment ending position on read. */
        int64_t *t = (int64_t*)pvH;
        int32_t column_len = segLen * segWidth;
        for (i = 0; i<column_len; ++i, ++t) {
            int32_t temp = i / segWidth + i % segWidth * segLen;
            if (temp >= s1Len) continue;
            if (*t > score) {
                score = *t;
                end_query = temp;
                end_ref = s2Len-1;
            }
            else if (*t == score && end_ref == s2Len-1 && temp < end_query) {
                end_query = temp;
            }
        }
    }

    if (!s1_end && !s2_end) {
        /* extract last value from the last column */
        {
            __m256i vH = _mm256_load_si256(pvH + offset);
            for (k=0; k<position; ++k) {
                vH = _mm256_slli_si256_rpl(vH, 8);
            }
            score = (int64_t) _mm256_extract_epi64_rpl (vH, 3);
            end_ref = s2Len - 1;
            end_query = s1Len - 1;
        }
    }

    if (_mm256_movemask_epi8(_mm256_or_si256(
            _mm256_cmplt_epi64_rpl(vSaturationCheckMin, vNegLimit),
            _mm256_cmpgt_epi64(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(pvGapper);
    parasail_free(pvH);
    parasail_free(pvHt);
    parasail_free(boundary);
    parasail_free(pvE);

    return result;
}